

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::pumpFromFile
          (AsyncStreamFd *this,FileInputStream *input,int fileFd,uint64_t amount,uint64_t soFar)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  OwnPromiseNode node;
  int iVar3;
  ssize_t sVar4;
  void *pvVar5;
  undefined4 in_register_00000014;
  int iVar6;
  PromiseArena *in_R9;
  size_t __count;
  TransformPromiseNodeBase *this_00;
  Fault f;
  off_t offset;
  undefined1 local_98 [16];
  PromiseArena *local_88;
  PromiseBase local_80;
  PromiseArena *local_78;
  Fault local_70;
  OwnPromiseNode local_68;
  AsyncInputStream local_60;
  SourceLocation local_58;
  ReadableFile **local_40;
  ReadableFile **local_38;
  
  local_98._8_8_ = CONCAT44(in_register_00000014,fileFd);
  local_40 = &input[1].file;
  local_38 = &input->file;
  local_80.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  local_78 = (PromiseArena *)soFar;
  do {
    __count = (long)local_78 - (long)in_R9;
    if (local_78 < in_R9 || __count == 0) goto LAB_004b6247;
    local_60._vptr_AsyncInputStream =
         ((AsyncInputStream *)(local_98._8_8_ + 0x10))->_vptr_AsyncInputStream;
    local_88 = in_R9;
    if (0xfffffffe < __count) {
      __count = 0xffffffff;
    }
    do {
      iVar6 = (int)amount;
      sVar4 = sendfile64((int)input->offset,iVar6,(__off64_t *)&local_60,__count);
      if (-1 < sVar4) {
        iVar3 = 0;
        break;
      }
      iVar3 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar3 == -1);
    in_R9 = local_88;
    if (iVar3 < 0x16) {
      if (iVar3 != 0) {
        if (iVar3 != 0xb) goto LAB_004b6282;
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_98);
        uVar2 = local_98._0_8_;
        pPVar1 = (PromiseArena *)
                 ((SleepHooks *)&((PromiseArenaMember *)local_98._0_8_)->arena)->_vptr_SleepHooks;
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_98._0_8_ - (long)pPVar1) < 0x48) {
          pvVar5 = operator_new(0x400);
          this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3b8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)local_98,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:285:21)>
                     ::anon_class_40_5_87a5c74d_for_func::operator());
          *(undefined ***)((long)pvVar5 + 0x3b8) = &PTR_destroy_0070e068;
          *(FileInputStream **)((long)pvVar5 + 0x3d8) = input;
          *(undefined8 *)((long)pvVar5 + 0x3e0) = local_98._8_8_;
          *(int *)((long)pvVar5 + 1000) = iVar6;
          *(PromiseArena **)((long)pvVar5 + 0x3f0) = local_78;
          *(PromiseArena **)((long)pvVar5 + 0x3f8) = local_88;
          *(void **)((long)pvVar5 + 0x3c0) = pvVar5;
        }
        else {
          ((SleepHooks *)&((PromiseArenaMember *)local_98._0_8_)->arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          this_00 = (TransformPromiseNodeBase *)
                    &((PromiseArenaMember *)(local_98._0_8_ + -0x50))->arena;
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)local_98,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:285:21)>
                     ::anon_class_40_5_87a5c74d_for_func::operator());
          ((PromiseArenaMember *)(uVar2 + -0x50))->arena = (PromiseArena *)&PTR_destroy_0070e068;
          ((PromiseArenaMember *)(uVar2 + -0x30))->arena = (PromiseArena *)input;
          ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember =
               (_func_int **)local_98._8_8_;
          *(int *)&((PromiseArenaMember *)(uVar2 + -0x20))->arena = iVar6;
          ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)local_78
          ;
          ((PromiseArenaMember *)(uVar2 + -0x10))->arena = local_88;
          ((PromiseArenaMember *)(uVar2 + -0x40))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
        }
        in_R9 = local_88;
        local_58.fileName =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
        ;
        local_58.function = "then";
        local_58.lineNumber = 0x58b;
        local_58.columnNumber = 0x4c;
        local_68.ptr = &this_00->super_PromiseNode;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_70,&local_68,&local_58);
        node.ptr = local_68.ptr;
        ((PromiseArenaMember *)local_80.node.ptr)->_vptr_PromiseArenaMember =
             (_func_int **)local_70.exception;
        if ((TransformPromiseNodeBase *)local_68.ptr != (TransformPromiseNodeBase *)0x0) {
          local_68.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
        }
        uVar2 = local_98._0_8_;
        if ((UnixEventPort *)local_98._0_8_ != (UnixEventPort *)0x0) {
          local_98._0_8_ = (UnixEventPort *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
        }
        goto LAB_004b6227;
      }
      if (sVar4 == 0) {
        iVar6 = 3;
      }
      else {
        ((AsyncInputStream *)(local_98._8_8_ + 0x10))->_vptr_AsyncInputStream =
             local_60._vptr_AsyncInputStream;
        iVar6 = 0;
        in_R9 = (PromiseArena *)((long)local_88->bytes + sVar4);
      }
    }
    else {
      if ((iVar3 != 0x26) && (iVar3 != 0x16)) {
LAB_004b6282:
        local_70.exception = (Exception *)0x0;
        local_58.fileName = (char *)0x0;
        local_58.function = (char *)0x0;
        kj::_::Debug::Fault::init
                  (&local_70,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_70);
      }
      unoptimizedPumpTo((kj *)local_80.node.ptr,(AsyncInputStream *)local_98._8_8_,
                        (AsyncOutputStream *)local_38,(uint64_t)local_78,(uint64_t)local_88);
LAB_004b6227:
      iVar6 = 1;
    }
  } while (iVar6 == 0);
  if (iVar6 != 1) {
LAB_004b6247:
    local_58.fileName = (char *)in_R9;
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
              ((PromiseDisposer *)&local_70,(unsigned_long *)&local_58);
    ((PromiseArenaMember *)local_80.node.ptr)->_vptr_PromiseArenaMember =
         (_func_int **)local_70.exception;
  }
  return (Promise<unsigned_long>)(PromiseNode *)local_80.node.ptr;
}

Assistant:

Promise<uint64_t> pumpFromFile(FileInputStream& input, int fileFd,
                                 uint64_t amount, uint64_t soFar) {
    while (soFar < amount) {
      off_t offset = input.getOffset();
      ssize_t n;

      // Although sendfile()'s last argument has type size_t, on Linux it seems to cause EINVAL
      // if we pass an amount that is greater than UINT32_MAX, so make sure to clamp to that. In
      // practice, of course, we'll be limited to the socket buffer size.
      size_t requested = kj::min(amount - soFar, (uint32_t)kj::maxValue);

      KJ_SYSCALL_HANDLE_ERRORS(n = sendfile(fd, fileFd, &offset, requested)) {
        case EINVAL:
        case ENOSYS:
          // Fall back to regular pump
          return unoptimizedPumpTo(input, *this, amount, soFar);

        case EAGAIN:
          return observer.whenBecomesWritable()
              .then([this, &input, fileFd, amount, soFar]() {
            return pumpFromFile(input, fileFd, amount, soFar);
          });

        default:
          KJ_FAIL_SYSCALL("sendfile", error);
      }

      if (n == 0) break;

      input.seek(offset);  // NOTE: sendfile() updated `offset` in-place.
      soFar += n;
    }

    return soFar;
  }